

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow_p.h
# Opt level: O0

int __thiscall QMdiSubWindowPrivate::titleBarHeight(QMdiSubWindowPrivate *this)

{
  long lVar1;
  bool bVar2;
  Int IVar3;
  int iVar4;
  QWidget *this_00;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  int height;
  QMdiSubWindow *q;
  QStyleOptionTitleBar options;
  undefined4 in_stack_ffffffffffffff48;
  WindowType in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  byte local_9d;
  int local_9c;
  int local_84;
  QFlagsStorageHelper<Qt::WindowType,_4> local_7c;
  QMdiSubWindowPrivate *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &q_func(in_RDI)->super_QWidget;
  local_9d = 1;
  if (*(long *)&(in_RDI->super_QWidgetPrivate).field_0x10 != 0) {
    QWidget::windowFlags((QWidget *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    local_7c.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator&
                   ((QFlags<Qt::WindowType> *)
                    CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    in_stack_ffffffffffffff4c);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_7c);
    local_9d = 1;
    if (IVar3 == 0) {
      bVar2 = QWidget::isMaximized(this_00);
      in_stack_ffffffffffffff54 = in_stack_ffffffffffffff54 & 0xffffff;
      if (bVar2) {
        bVar2 = drawTitleBarWhenMaximized(in_RDI);
        in_stack_ffffffffffffff54 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff54) ^ 0xff000000;
      }
      local_9d = (byte)(in_stack_ffffffffffffff54 >> 0x18);
    }
  }
  if ((local_9d & 1) == 0) {
    memset(&stack0xffffffffffffff88,0xaa,0x70);
    titleBarOptions(in_stack_ffffffffffffff88);
    local_9c = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
    ;
    bVar2 = hasBorder((QMdiSubWindowPrivate *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      (QStyleOptionTitleBar *)
                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (bVar2) {
      bVar2 = QWidget::isMinimized(this_00);
      iVar4 = 4;
      if (bVar2) {
        iVar4 = 8;
      }
      local_9c = iVar4 + local_9c;
    }
    local_84 = local_9c;
    QStyleOptionTitleBar::~QStyleOptionTitleBar
              ((QStyleOptionTitleBar *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
              );
  }
  else {
    local_84 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_84;
}

Assistant:

inline int titleBarHeight() const
    {
        Q_Q(const QMdiSubWindow);
        if (!parent || q->windowFlags() & Qt::FramelessWindowHint
            || (q->isMaximized() && !drawTitleBarWhenMaximized())) {
            return 0;
        }
        QStyleOptionTitleBar options = titleBarOptions();
        int height = options.rect.height();
        if (hasBorder(options))
            height += q->isMinimized() ? 8 : 4;
        return height;
    }